

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

void __thiscall
trompeloeil::call_matcher<void_(),_std::tuple<>_>::run_actions
          (call_matcher<void_(),_std::tuple<>_> *this,call_params_type_t<void_()> *params,
          call_matcher_list<void_()> *saturated_list)

{
  trompeloeil *this_00;
  char *pcVar1;
  list_elem<trompeloeil::side_effect_base<void_()>_> *plVar2;
  int iVar3;
  ulong uVar4;
  call_params_type_t<void_()> *name;
  sequence_handler_base *psVar5;
  string *in_R8;
  side_effect_base<void_()> *a;
  location loc;
  unique_lock<std::recursive_mutex> lock;
  string local_50;
  
  name = params;
  if (((this->sequences)._M_t.
       super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
       ._M_t.
       super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
       .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl)->max_calls
      == 0) {
    this->reported = true;
    this_00 = (trompeloeil *)(this->super_call_matcher_base<void_()>).name;
    name = (call_params_type_t<void_()> *)(this->super_call_matcher_base<void_()>).loc.file;
    pcVar1 = (char *)(this->super_call_matcher_base<void_()>).loc.line;
    params_string<>(&local_50,params);
    loc.line = (unsigned_long)&local_50;
    loc.file = pcVar1;
    report_forbidden_call(this_00,(char *)name,loc,in_R8);
    std::__cxx11::string::~string((string *)&local_50);
  }
  get_lock<void>();
  iVar3 = (*((this->sequences)._M_t.
             super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
             .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl)->
            _vptr_sequence_handler_base[3])();
  if ((char)iVar3 == '\0') {
    psVar5 = (this->sequences)._M_t.
             super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
             .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl;
    name = (call_params_type_t<void_()> *)0x0;
    (*psVar5->_vptr_sequence_handler_base[2])
              (psVar5,0,(this->super_call_matcher_base<void_()>).name,
               (this->super_call_matcher_base<void_()>).loc.file,
               (this->super_call_matcher_base<void_()>).loc.line);
  }
  psVar5 = (this->sequences)._M_t.
           super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
           ._M_t.
           super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
           .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl;
  uVar4 = psVar5->call_count + 1;
  psVar5->call_count = uVar4;
  if (psVar5->min_calls <= uVar4) {
    (*psVar5->_vptr_sequence_handler_base[6])();
    psVar5 = (this->sequences)._M_t.
             super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
             .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl;
    uVar4 = psVar5->call_count;
  }
  if (uVar4 == psVar5->max_calls) {
    (*psVar5->_vptr_sequence_handler_base[5])();
    list_elem<trompeloeil::call_matcher_base<void_()>_>::unlink
              ((list_elem<trompeloeil::call_matcher_base<void_()>_> *)this,(char *)name);
    list<trompeloeil::call_matcher_base<void_()>,_trompeloeil::ignore_disposer>::push_back
              (&saturated_list->
                super_list<trompeloeil::call_matcher_base<void_()>,_trompeloeil::ignore_disposer>,
               &this->super_call_matcher_base<void_()>);
  }
  plVar2 = &(this->actions).super_list_elem<trompeloeil::side_effect_base<void_()>_>;
  while (plVar2 = plVar2->next,
        plVar2 != &(this->actions).super_list_elem<trompeloeil::side_effect_base<void_()>_>) {
    (*plVar2->_vptr_list_elem[2])(plVar2,params);
  }
  Catch::clara::std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_50);
  return;
}

Assistant:

void
    run_actions(
      call_params_type_t<Sig>& params,
      call_matcher_list<Sig> &saturated_list)
    override
    {
      if (sequences->is_forbidden())
      {
        reported = true;
        report_forbidden_call(name, loc, params_string(params));
      }
      auto lock = get_lock();
      {
        if (!sequences->can_be_called())
        {
          sequences->validate(severity::fatal, name, loc);
        }
        sequences->increment_call();
        if (sequences->is_satisfied())
        {
          sequences->retire_predecessors();
        }
        if (sequences->is_saturated())
        {
          sequences->retire();
          this->unlink();
          saturated_list.push_back(this);
        }
      }
      for (auto& a : actions) a.action(params);
    }